

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_overlay.cpp
# Opt level: O2

array<unsigned_long,_8UL> * __thiscall
Omega_h::Overlay::get_cell_nodes
          (array<unsigned_long,_8UL> *__return_storage_ptr__,Overlay *this,size_t cell)

{
  size_t i;
  long lVar1;
  long lVar2;
  LOs cells2nodes;
  Adj local_40;
  
  Omega_h::Mesh::get_adj(&local_40,&this->mesh,3,0);
  Write<int>::Write(&cells2nodes.write_,&local_40.super_Graph.ab2b.write_);
  Adj::~Adj(&local_40);
  lVar2 = cell << 0x23;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    __return_storage_ptr__->_M_elems[lVar1] =
         (long)*(int *)((long)cells2nodes.write_.shared_alloc_.direct_ptr + (lVar2 >> 0x1e));
    lVar2 = lVar2 + 0x100000000;
  }
  Write<int>::~Write(&cells2nodes.write_);
  return __return_storage_ptr__;
}

Assistant:

std::array<size_t, 8> Overlay::get_cell_nodes(size_t cell) const {
  std::array<size_t, 8> nodes;
  auto cells2nodes = mesh.get_adj(REGION, VERT).ab2b;
  for (size_t i = 0; i < 8; ++i) {
    nodes[i] = size_t(cells2nodes[LO(cell * 8 + i)]);
  }
  return nodes;
}